

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  pointer pIVar1;
  bool bVar2;
  ItemVector *pIVar3;
  pointer this_00;
  pointer pIVar4;
  long lVar5;
  long lVar6;
  
  pIVar3 = cmComputeLinkInformation::GetItems(cli);
  this_00 = (pIVar3->
            super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (pIVar3->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pIVar1 - (long)this_00;
  for (lVar6 = lVar5 / 0x48 >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                          *)this_00,
                         (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                          )cli);
    pIVar4 = this_00;
    if (bVar2) goto LAB_003b4a98;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                          *)(this_00 + 1),
                         (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                          )cli);
    pIVar4 = this_00 + 1;
    if (bVar2) goto LAB_003b4a98;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                          *)(this_00 + 2),
                         (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                          )cli);
    pIVar4 = this_00 + 2;
    if (bVar2) goto LAB_003b4a98;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                          *)(this_00 + 3),
                         (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                          )cli);
    pIVar4 = this_00 + 3;
    if (bVar2) goto LAB_003b4a98;
    this_00 = this_00 + 4;
    lVar5 = lVar5 + -0x120;
  }
  lVar5 = lVar5 / 0x48;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pIVar4 = pIVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
                  ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                                *)this_00,
                               (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                )cli), pIVar4 = this_00, bVar2)) goto LAB_003b4a98;
      this_00 = this_00 + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
            ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                          *)this_00,
                         (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                          )cli);
    pIVar4 = this_00;
    if (bVar2) goto LAB_003b4a98;
    this_00 = this_00 + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::$_0>
          ::operator()((_Iter_pred<cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(cmComputeLinkInformation&)::__0>
                        *)this_00,
                       (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                        )cli);
  pIVar4 = this_00;
  if (!bVar2) {
    pIVar4 = pIVar1;
  }
LAB_003b4a98:
  return pIVar4 != pIVar1;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  return std::any_of(
    items.begin(), items.end(),
    [](cmComputeLinkInformation::Item const& item) -> bool {
      return item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY &&
        // this dependency requires us to device link it
        !item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS") &&
        item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION");
    });
}